

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

int __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ElementCompare::operator()(ElementCompare *this,Element *e1,Element *e2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Element *pEVar5;
  uint *puVar6;
  uint *puVar7;
  uint local_190 [28];
  int local_120;
  undefined1 local_11c;
  undefined8 local_118;
  uint local_110 [28];
  int local_a0;
  undefined1 local_9c;
  undefined8 local_98;
  uint local_90 [28];
  int local_20;
  undefined1 local_1c;
  undefined8 local_18;
  
  pEVar5 = e1;
  puVar6 = local_90;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = (pEVar5->val).m_backend.data._M_elems[0];
    pEVar5 = (Element *)((pEVar5->val).m_backend.data._M_elems + 1);
    puVar6 = puVar6 + 1;
  }
  local_20 = (e1->val).m_backend.exp;
  local_1c = (e1->val).m_backend.neg;
  local_18._0_4_ = (e1->val).m_backend.fpclass;
  local_18._4_4_ = (e1->val).m_backend.prec_elem;
  pEVar5 = e2;
  puVar6 = local_110;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = (pEVar5->val).m_backend.data._M_elems[0];
    pEVar5 = (Element *)((pEVar5->val).m_backend.data._M_elems + 1);
    puVar6 = puVar6 + 1;
  }
  local_a0 = (e2->val).m_backend.exp;
  local_9c = (e2->val).m_backend.neg;
  local_98._0_4_ = (e2->val).m_backend.fpclass;
  local_98._4_4_ = (e2->val).m_backend.prec_elem;
  puVar6 = (uint *)this;
  puVar7 = local_190;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    puVar7 = puVar7 + 1;
  }
  local_120 = (this->epsiloncompare).m_backend.exp;
  local_11c = (this->epsiloncompare).m_backend.neg;
  local_118._0_4_ = (this->epsiloncompare).m_backend.fpclass;
  local_118._4_4_ = (this->epsiloncompare).m_backend.prec_elem;
  bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_90,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_110,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_190);
  uVar3 = 0;
  if (((!bVar1) && (uVar3 = 1, (e1->val).m_backend.fpclass != cpp_dec_float_NaN)) &&
     ((e2->val).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)e1,(cpp_dec_float<200U,_int,_void> *)e2);
    uVar3 = iVar2 >> 0x1f | 1;
  }
  return uVar3;
}

Assistant:

int operator()(const typename SVectorBase<R>::Element& e1,
                     const typename SVectorBase<R>::Element& e2) const
      {
         if(EQ(e1.val, e2.val, this->epsiloncompare))
            return 0;

         if(e1.val < e2.val)
            return -1;
         else // (e1.val > e2.val)
            return 1;
      }